

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zeroize.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  ulong uVar4;
  char buf [1024];
  char local_428 [1032];
  
  if (argc != 2) {
    puts("This program takes exactly 1 agument");
    usage();
    return 1;
  }
  __stream = fopen(argv[1],"r");
  if (__stream == (FILE *)0x0) {
    printf("Could not open file \'%s\'\n",argv[1]);
    return 1;
  }
  iVar2 = fgetc(__stream);
  if (iVar2 == -1) {
    local_428[0] = '\0';
  }
  else {
    uVar1 = 0;
    iVar3 = iVar2;
    do {
      uVar4 = uVar1;
      local_428[uVar4] = (char)iVar3;
      iVar3 = fgetc(__stream);
      if (iVar3 == -1) break;
      uVar1 = uVar4 + 1;
    } while (uVar4 < 0x3fe);
    local_428[uVar4 + 1] = '\0';
    if (iVar2 != -1) {
      puts(local_428);
      iVar2 = 0;
      goto LAB_00101288;
    }
  }
  puts("The file is empty!");
  iVar2 = 1;
LAB_00101288:
  fclose(__stream);
  mbedtls_platform_zeroize(local_428,0x400);
  return iVar2;
}

Assistant:

int main( int argc, char** argv )
{
    int exit_code = MBEDTLS_EXIT_FAILURE;
    FILE *fp;
    char buf[BUFFER_LEN];
    char *p = buf;
    char *end = p + BUFFER_LEN;
    int c;

    if( argc != 2 )
    {
        mbedtls_printf( "This program takes exactly 1 agument\n" );
        usage();
        return( exit_code );
    }

    fp = fopen( argv[1], "r" );
    if( fp == NULL )
    {
        mbedtls_printf( "Could not open file '%s'\n", argv[1] );
        return( exit_code );
    }

    while( ( c = fgetc( fp ) ) != EOF && p < end - 1 )
        *p++ = (char)c;
    *p = '\0';

    if( p - buf != 0 )
    {
        mbedtls_printf( "%s\n", buf );
        exit_code = MBEDTLS_EXIT_SUCCESS;
    }
    else
        mbedtls_printf( "The file is empty!\n" );

    fclose( fp );
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( exit_code );
}